

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O2

void set_state(memdesc *desc,memstate state)

{
  size_t sVar1;
  guard *pgVar2;
  size_t i;
  long lVar3;
  memstate local_c [2];
  memstate state_local;
  
  local_c[0] = state;
  sVar1 = desc->len;
  pgVar2 = desc->data;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    *(undefined1 *)((long)&pgVar2[1].desc + lVar3 + sVar1) = *(undefined1 *)((long)local_c + lVar3);
  }
  desc->data->state = state;
  return;
}

Assistant:

static void
set_state(struct memdesc *desc, enum memstate state)
{
    char *p = (char *)(desc->data + 1) + desc->len;
    char *q = (char *)&state;
    q = (char *)&state;
    for (size_t i = 0; i < sizeof state; i++)
        p[i] = q[i];
    desc->data->state = state;
}